

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

int __thiscall rcg::Device::getAvailableModuleEvents(Device *this)

{
  GC_ERROR GVar1;
  int iVar2;
  element_type *peVar3;
  lock_guard<std::mutex> *in_RDI;
  size_t size;
  INFO_DATATYPE type;
  size_t ret;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t local_28;
  INFO_DATATYPE local_1c;
  undefined8 local_18 [3];
  
  std::lock_guard<std::mutex>::lock_guard
            (in_RDI,(mutex_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  local_18[0] = 0;
  local_28 = 8;
  if (in_RDI[0x12]._M_device != (mutex_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1170d0);
    GVar1 = (*peVar3->EventGetInfo)(in_RDI[0x12]._M_device,1,&local_1c,local_18,&local_28);
    if (GVar1 != 0) {
      local_18[0] = 0;
    }
  }
  iVar2 = (int)local_18[0];
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11713e);
  return iVar2;
}

Assistant:

int Device::getAvailableModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);
  size_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (event != 0)
  {
    if (gentl->EventGetInfo(event, GenTL::EVENT_NUM_IN_QUEUE, &type, &ret, &size) != GenTL::GC_ERR_SUCCESS)
    {
      ret=0;
    }
  }

  return static_cast<int>(ret);
}